

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32_tests.cpp
# Opt level: O1

TestVector * __thiscall
anon_unknown.dwarf_3efeb7::TestVector::operator()
          (TestVector *this,string *pub,string *prv,uint nChild)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  long lVar4;
  pointer pTVar5;
  pointer pTVar6;
  undefined8 uVar7;
  ulong uVar8;
  pointer pTVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  undefined8 *puVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  pointer pTVar17;
  _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
  *this_00;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar5 = (this->vDerive).
           super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar5 == (this->vDerive).
                super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pTVar6 = (this->vDerive).
             super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)pTVar5 - (long)pTVar6;
    if (lVar15 == 0x7ffffffffffffff8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      goto LAB_002c07ad;
    }
    uVar11 = (lVar15 >> 3) * -0x71c71c71c71c71c7;
    uVar8 = 1;
    if (pTVar5 != pTVar6) {
      uVar8 = uVar11;
    }
    this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
               *)(uVar8 + uVar11);
    if ((_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
         *)0x1c71c71c71c71c6 < this_00) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    if (CARRY8(uVar8,uVar11)) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    pTVar9 = std::
             _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ::_M_allocate(this_00,(size_t)pub);
    puVar2 = (undefined8 *)((long)pTVar9 + lVar15);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar3 = (undefined1 *)((long)pTVar9 + lVar15 + 0x10);
    *(undefined1 **)(puVar3 + -0x10) = puVar3;
    *(undefined8 *)(puVar3 + -8) = 0;
    *puVar3 = 0;
    *(undefined8 **)(puVar3 + 0x10) = puVar2 + 6;
    *(undefined8 *)(puVar3 + 0x18) = 0;
    puVar3[0x20] = 0;
    pTVar17 = pTVar9;
    if (pTVar5 != pTVar6) {
      lVar15 = 0;
      do {
        lVar16 = lVar15;
        plVar12 = (long *)((pTVar9->pub).field_2._M_local_buf + lVar16);
        *(long **)((long)&(pTVar9->pub)._M_dataplus._M_p + lVar16) = plVar12;
        puVar2 = (undefined8 *)((long)&(pTVar6->pub)._M_dataplus._M_p + lVar16);
        plVar10 = puVar2 + 2;
        if (plVar10 == (long *)*puVar2) {
          uVar7 = puVar2[3];
          *plVar12 = *plVar10;
          *(undefined8 *)((long)&(pTVar9->pub).field_2 + lVar16 + 8) = uVar7;
        }
        else {
          plVar12 = (long *)((long)&(pTVar9->pub)._M_dataplus._M_p + lVar16);
          *plVar12 = (long)*puVar2;
          plVar12[2] = *plVar10;
        }
        puVar2 = (undefined8 *)((long)&(pTVar6->pub)._M_dataplus._M_p + lVar16);
        puVar13 = puVar2 + 6;
        *(undefined8 *)((long)&(pTVar9->pub)._M_string_length + lVar16) = puVar2[1];
        *puVar2 = plVar10;
        puVar2[1] = 0;
        *(undefined1 *)(puVar2 + 2) = 0;
        pcVar14 = (pTVar9->prv).field_2._M_local_buf + lVar16;
        *(char **)((long)&(pTVar9->prv)._M_dataplus._M_p + lVar16) = pcVar14;
        if (puVar13 == (undefined8 *)puVar2[4]) {
          uVar7 = puVar2[7];
          *(undefined8 *)pcVar14 = *puVar13;
          *(undefined8 *)((long)&(pTVar9->prv).field_2 + lVar16 + 8) = uVar7;
        }
        else {
          *(undefined8 **)((long)&(pTVar9->prv)._M_dataplus._M_p + lVar16) = (undefined8 *)puVar2[4]
          ;
          *(undefined8 *)((long)&(pTVar9->prv).field_2 + lVar16) = *puVar13;
        }
        *(undefined8 *)((long)&(pTVar9->prv)._M_string_length + lVar16) =
             *(undefined8 *)((long)&(pTVar6->prv)._M_string_length + lVar16);
        *(undefined8 **)((long)&(pTVar6->prv)._M_dataplus._M_p + lVar16) = puVar13;
        *(undefined8 *)((long)&(pTVar6->prv)._M_string_length + lVar16) = 0;
        (pTVar6->prv).field_2._M_local_buf[lVar16] = '\0';
        *(undefined4 *)((long)&pTVar9->nChild + lVar16) =
             *(undefined4 *)((long)&pTVar6->nChild + lVar16);
        plVar12 = *(long **)((long)&(pTVar6->pub)._M_dataplus._M_p + lVar16);
        if (plVar10 != plVar12) {
          operator_delete(plVar12,*plVar10 + 1);
        }
        lVar15 = lVar16 + 0x48;
      } while ((pointer)((long)&pTVar6[1].pub._M_dataplus._M_p + lVar16) != pTVar5);
      pTVar17 = (pointer)((long)&pTVar9[1].pub._M_dataplus._M_p + lVar16);
    }
    if (pTVar6 != (pointer)0x0) {
      operator_delete(pTVar6,(long)(this->vDerive).
                                   super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar6
                     );
    }
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar9;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar17 + 1;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar9 + (long)this_00;
  }
  else {
    (pTVar5->pub)._M_dataplus._M_p = (pointer)0x0;
    (pTVar5->pub)._M_string_length = 0;
    (pTVar5->pub).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar5->pub).field_2 + 8) = 0;
    (pTVar5->prv)._M_dataplus._M_p = (pointer)0x0;
    (pTVar5->prv)._M_string_length = 0;
    (pTVar5->prv).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar5->prv).field_2 + 8) = 0;
    *(undefined8 *)&pTVar5->nChild = 0;
    (pTVar5->pub)._M_dataplus._M_p = (pointer)&(pTVar5->pub).field_2;
    (pTVar5->pub)._M_string_length = 0;
    (pTVar5->pub).field_2._M_local_buf[0] = '\0';
    (pTVar5->prv)._M_dataplus._M_p = (pointer)&(pTVar5->prv).field_2;
    (pTVar5->prv)._M_string_length = 0;
    (pTVar5->prv).field_2._M_local_buf[0] = '\0';
    ppTVar1 = &(this->vDerive).
               super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  pTVar5 = (this->vDerive).
           super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar5[-1].pub,pub);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar5[-1].prv,prv);
  pTVar5[-1].nChild = nChild;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return this;
  }
LAB_002c07ad:
  __stack_chk_fail();
}

Assistant:

TestVector& operator()(std::string pub, std::string prv, unsigned int nChild) {
        vDerive.emplace_back();
        TestDerivation &der = vDerive.back();
        der.pub = pub;
        der.prv = prv;
        der.nChild = nChild;
        return *this;
    }